

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-trust-schema-rule.c
# Opt level: O0

int ndn_trust_schema_rule_copy(ndn_trust_schema_rule_t *lhs,ndn_trust_schema_rule_t *rhs)

{
  int ret_val;
  ndn_trust_schema_rule_t *rhs_local;
  ndn_trust_schema_rule_t *lhs_local;
  
  lhs_local._4_4_ = ndn_trust_schema_pattern_copy(&lhs->data_pattern,&rhs->data_pattern);
  if ((lhs_local._4_4_ == 0) &&
     (lhs_local._4_4_ = ndn_trust_schema_pattern_copy(&lhs->key_pattern,&rhs->key_pattern),
     lhs_local._4_4_ == 0)) {
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

int
ndn_trust_schema_rule_copy(const ndn_trust_schema_rule_t *lhs, ndn_trust_schema_rule_t *rhs)
{
  int ret_val = -1;

  ret_val = ndn_trust_schema_pattern_copy(&lhs->data_pattern, &rhs->data_pattern);
  if (ret_val != 0) return ret_val;

  ret_val = ndn_trust_schema_pattern_copy(&lhs->key_pattern, &rhs->key_pattern);
  if (ret_val != 0) return ret_val;

  return 0;
}